

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O3

void wavread(char *filename,int *fs,int *nbit,double *x)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_t sVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  uchar for_int_number [4];
  undefined4 local_6c;
  char local_68;
  byte abStack_65 [9];
  int local_5c;
  int *local_58;
  byte *local_50;
  double local_48;
  ulong local_40;
  double *local_38;
  
  local_38 = x;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File not found.");
    return;
  }
  iVar4 = anon_unknown.dwarf_a773::CheckHeader((FILE *)__stream);
  if (iVar4 != 0) {
    local_68 = '\0';
    local_6c = 0;
    lVar9 = 4;
    fread(abStack_65 + 1,1,4,__stream);
    uVar5 = 0;
    do {
      uVar5 = (uint)abStack_65[lVar9] | uVar5 << 8;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    *fs = uVar5;
    fseek(__stream,6,1);
    fread(abStack_65 + 1,1,2,__stream);
    *nbit = (uint)abStack_65[1];
    sVar6 = fread(&local_6c,1,1,__stream);
    if (sVar6 != 0) {
      do {
        if ((char)local_6c == 'd') {
          fread((void *)((long)&local_6c + 1),1,3,__stream);
          if (local_68 == '\0' && local_6c == 0x61746164) break;
          fseek(__stream,-3,1);
        }
        sVar6 = fread(&local_6c,1,1,__stream);
      } while (sVar6 != 0);
    }
    if (local_68 == '\0' && local_6c == 0x61746164) {
      lVar9 = 4;
      fread(abStack_65 + 1,1,4,__stream);
      uVar5 = 0;
      do {
        uVar5 = (uint)abStack_65[lVar9] | uVar5 << 8;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      uVar2 = *nbit;
      local_40 = (ulong)uVar2;
      uVar11 = uVar2 + 7;
      if (-1 < (int)uVar2) {
        uVar11 = uVar2;
      }
      local_5c = (int)uVar11 >> 3;
      lVar9 = (long)local_5c;
      local_58 = nbit;
      local_48 = ldexp(1.0,uVar2 - 1);
      if (0 < (int)((long)(int)uVar5 / lVar9)) {
        sVar6 = (size_t)local_5c;
        local_50 = abStack_65 + (sVar6 - 1 & 0xffffffff) + 5;
        uVar10 = 0;
        do {
          fread(abStack_65 + 5,1,sVar6,__stream);
          bVar1 = abStack_65[sVar6 + 4];
          dVar12 = 0.0;
          if ((char)bVar1 < '\0') {
            dVar12 = ldexp(1.0,*local_58 + -1);
            abStack_65[sVar6 + 4] = bVar1 & 0x7f;
          }
          dVar13 = 0.0;
          pbVar7 = local_50;
          iVar4 = local_5c;
          if (7 < (int)local_40) {
            do {
              dVar13 = dVar13 * 256.0 + (double)*pbVar7;
              iVar8 = iVar4 + -1;
              bVar3 = 0 < iVar4;
              pbVar7 = pbVar7 + -1;
              iVar4 = iVar8;
            } while (iVar8 != 0 && bVar3);
          }
          local_38[uVar10] = (dVar13 - dVar12) / local_48;
          uVar10 = uVar10 + 1;
        } while (uVar10 != ((long)(int)uVar5 / lVar9 & 0xffffffffU));
      }
    }
    else {
      puts("data error.");
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void wavread(const char* filename, int *fs, int *nbit, double *x) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File not found.\n");
    return;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return;
  }

  int x_length;
  if (0 == GetParameters(fp, fs, nbit, &x_length)) {
    fclose(fp);
    return;
  }

  int quantization_byte = *nbit / 8;
  double zero_line = pow(2.0, *nbit - 1);
  double tmp, sign_bias;
  unsigned char for_int_number[4];
  for (int i = 0; i < x_length; ++i) {
    sign_bias = tmp = 0.0;
    fread(for_int_number, 1, quantization_byte, fp);  // "data"
    if (for_int_number[quantization_byte-1] >= 128) {
      sign_bias = pow(2.0, *nbit - 1);
      for_int_number[quantization_byte - 1] =
        for_int_number[quantization_byte - 1] & 0x7F;
    }
    for (int j = quantization_byte - 1; j >= 0; --j)
      tmp = tmp * 256.0 + for_int_number[j];
    x[i] = (tmp - sign_bias) / zero_line;
  }
  fclose(fp);
}